

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_softmax_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1e9975c::FastSoftmaxTest::~FastSoftmaxTest(FastSoftmaxTest *this)

{
  float *pfVar1;
  
  (this->super_TestWithParam<std::tuple<void_(*const)(const_float_*,_float_*),_int>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__FastSoftmaxTest_01098ff0;
  (this->super_TestWithParam<std::tuple<void_(*const)(const_float_*,_float_*),_int>_>).
  super_WithParamInterface<std::tuple<void_(*const)(const_float_*,_float_*),_int>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__FastSoftmaxTest_01099030;
  pfVar1 = (this->input_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->input_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pfVar1 = (this->dst_buf_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->dst_buf_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pfVar1 = (this->ref_buf_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->ref_buf_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

void SetUp() override {
    ref_buf_.reset(new (std::nothrow) float[num_classes_]());
    ASSERT_NE(ref_buf_, nullptr);
    dst_buf_.reset(new (std::nothrow) float[num_classes_]());
    ASSERT_NE(dst_buf_, nullptr);
    input_.reset(new (std::nothrow) float[num_classes_]());
    ASSERT_NE(input_, nullptr);
  }